

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_min_max64_Test::~FastPForTest_fastpack_min_max64_Test
          (FastPForTest_fastpack_min_max64_Test *this)

{
  FastPForTest_fastpack_min_max64_Test *in_stack_00000010;
  
  ~FastPForTest_fastpack_min_max64_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_min_max64) {
    _genDataRandom(in64, 256);
    in64[0] = std::numeric_limits<int64_t>::min();
    in64[127] = std::numeric_limits<int64_t>::max();
    in64[128] = std::numeric_limits<int64_t>::min();
    in64[255] = std::numeric_limits<int64_t>::max();

    _verify64();
  }